

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall PrimitiveTestClass::Deserialize(PrimitiveTestClass *this,CJSON *json)

{
  char cVar1;
  uchar uVar2;
  short sVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  unsigned_long uVar8;
  longlong lVar9;
  unsigned_long_long uVar10;
  char *pcVar11;
  uchar *puVar12;
  short *psVar13;
  unsigned_short *puVar14;
  int *piVar15;
  uint *puVar16;
  long *plVar17;
  unsigned_long *puVar18;
  longlong *plVar19;
  unsigned_long_long *puVar20;
  float *pfVar21;
  double *pdVar22;
  longdouble *plVar23;
  TestArrObj *pTVar24;
  longdouble *in_RCX;
  longdouble in_ST0;
  float fVar25;
  double dVar26;
  size_t tmp;
  allocator<char> local_50 [8];
  undefined1 local_48 [32];
  undefined1 local_28 [23];
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"c",(allocator<char> *)local_28);
  local_50[0] = (allocator<char>)0x0;
  cVar1 = CJSON::GetValue<char,_nullptr>(json,(string *)local_48,(char *)local_50);
  this->c = cVar1;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"uc",(allocator<char> *)local_28);
  local_50[0] = (allocator<char>)0x0;
  uVar2 = CJSON::GetValue<unsigned_char,_nullptr>(json,(string *)local_48,(uchar *)local_50);
  this->uc = uVar2;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"s",local_50);
  local_28._0_2_ = 0;
  sVar3 = CJSON::GetValue<short,_nullptr>(json,(string *)local_48,(short *)local_28);
  this->s = sVar3;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"us",local_50);
  local_28._0_10_ = (unkuint10)(ulong)local_28._2_8_ << 0x10;
  uVar4 = CJSON::GetValue<unsigned_short,_nullptr>
                    (json,(string *)local_48,(unsigned_short *)local_28);
  this->us = uVar4;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"i",local_50);
  local_28._0_10_ = (unkuint10)(uint6)local_28._4_6_ << 0x20;
  iVar5 = CJSON::GetValue<int,_nullptr>(json,(string *)local_48,(int *)local_28);
  this->i = iVar5;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"ui",local_50);
  local_28._0_10_ = (unkuint10)(uint6)local_28._4_6_ << 0x20;
  uVar6 = CJSON::GetValue<unsigned_int,_nullptr>(json,(string *)local_48,(uint *)local_28);
  this->ui = uVar6;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"l",local_50);
  local_28._0_10_ = (unkuint10)(ushort)local_28._8_2_ << 0x40;
  lVar7 = CJSON::GetValue<long,_nullptr>(json,(string *)local_48,(long *)local_28);
  this->l = lVar7;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"ul",local_50);
  local_28._0_10_ = (unkuint10)(ushort)local_28._8_2_ << 0x40;
  uVar8 = CJSON::GetValue<unsigned_long,_nullptr>(json,(string *)local_48,(unsigned_long *)local_28)
  ;
  this->ul = uVar8;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"ll",local_50);
  local_28._0_10_ = (unkuint10)(ushort)local_28._8_2_ << 0x40;
  lVar9 = CJSON::GetValue<long_long,_nullptr>(json,(string *)local_48,(longlong *)local_28);
  this->ll = lVar9;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"ull",local_50);
  local_28._0_10_ = (unkuint10)(ushort)local_28._8_2_ << 0x40;
  uVar10 = CJSON::GetValue<unsigned_long_long,_nullptr>
                     (json,(string *)local_48,(unsigned_long_long *)local_28);
  this->ull = uVar10;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"f",local_50);
  local_28._0_10_ = (unkuint10)(uint6)local_28._4_6_ << 0x20;
  fVar25 = CJSON::GetValue<float,_nullptr>(json,(string *)local_48,(float *)local_28);
  this->f = fVar25;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"d",local_50);
  local_28._0_10_ = (unkuint10)(ushort)local_28._8_2_ << 0x40;
  dVar26 = CJSON::GetValue<double,_nullptr>(json,(string *)local_48,(double *)local_28);
  this->d = dVar26;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"ld",local_50);
  local_28._0_10_ = (unkbyte10)0;
  CJSON::GetValue<long_double,_nullptr>
            ((longdouble *)json,(CJSON *)local_48,(string *)local_28,in_RCX);
  this->ld = in_ST0;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"str",local_50);
  local_28._0_10_ = (unkuint10)(ushort)local_28._8_2_ << 0x40;
  pcVar11 = CJSON::GetValue<char_*,_nullptr>(json,(string *)local_48,(char **)local_28);
  this->str = pcVar11;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"pc",(allocator<char> *)local_28);
  pcVar11 = CJSON::GetValue<char*>(json,(string *)local_48,(size_t *)local_50);
  this->pc = pcVar11;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"puc",(allocator<char> *)local_28);
  puVar12 = CJSON::GetValue<unsigned_char*>(json,(string *)local_48,(size_t *)local_50);
  this->puc = puVar12;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"ps",(allocator<char> *)local_28);
  psVar13 = CJSON::GetValue<short*>(json,(string *)local_48,(size_t *)local_50);
  this->ps = psVar13;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"pus",(allocator<char> *)local_28);
  puVar14 = CJSON::GetValue<unsigned_short*>(json,(string *)local_48,(size_t *)local_50);
  this->pus = puVar14;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"pi",(allocator<char> *)local_28);
  piVar15 = CJSON::GetValue<int*>(json,(string *)local_48,(size_t *)local_50);
  this->pi = piVar15;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"pui",(allocator<char> *)local_28);
  puVar16 = CJSON::GetValue<unsigned_int*>(json,(string *)local_48,(size_t *)local_50);
  this->pui = puVar16;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"pl",(allocator<char> *)local_28);
  plVar17 = CJSON::GetValue<long*>(json,(string *)local_48,(size_t *)local_50);
  this->pl = plVar17;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"pul",(allocator<char> *)local_28);
  puVar18 = CJSON::GetValue<unsigned_long*>(json,(string *)local_48,(size_t *)local_50);
  this->pul = puVar18;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"pll",(allocator<char> *)local_28);
  plVar19 = CJSON::GetValue<long_long*>(json,(string *)local_48,(size_t *)local_50);
  this->pll = plVar19;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"pull",(allocator<char> *)local_28);
  puVar20 = CJSON::GetValue<unsigned_long_long*>(json,(string *)local_48,(size_t *)local_50);
  this->pull = puVar20;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"pf",(allocator<char> *)local_28);
  pfVar21 = CJSON::GetValue<float*>(json,(string *)local_48,(size_t *)local_50);
  this->pf = pfVar21;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"pd",(allocator<char> *)local_28);
  pdVar22 = CJSON::GetValue<double*>(json,(string *)local_48,(size_t *)local_50);
  this->pd = pdVar22;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"pld",(allocator<char> *)local_28);
  plVar23 = CJSON::GetValue<long_double*>(json,(string *)local_48,(size_t *)local_50);
  this->pld = plVar23;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"pto",(allocator<char> *)local_28);
  pTVar24 = CJSON::GetValue<TestArrObj*>(json,(string *)local_48,(size_t *)local_50);
  this->pto = pTVar24;
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"spi",&local_11);
  CJSON::GetValue<std::shared_ptr<int>>((CJSON *)local_28,(string *)json,(size_t *)local_48);
  std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"spto",&local_11);
  CJSON::GetValue<std::shared_ptr<TestArrObj>>((CJSON *)local_28,(string *)json,(size_t *)local_48);
  std::__shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Deserialize(CJSON &json)
        {
            c = json.GetValue<char>("c");
            uc = json.GetValue<unsigned char>("uc");
            s = json.GetValue<short>("s");
            us = json.GetValue<unsigned short>("us");
            i = json.GetValue<int>("i");
            ui = json.GetValue<unsigned int>("ui");
            l = json.GetValue<long>("l");
            ul = json.GetValue<unsigned long>("ul");
            ll = json.GetValue<long long>("ll");
            ull = json.GetValue<unsigned long long>("ull");
            f = json.GetValue<float>("f");
            d = json.GetValue<double>("d");
            ld = json.GetValue<long double>("ld");

            str = json.GetValue<char*>("str");

            size_t tmp;

            pc = json.GetValue<char*>("pc", tmp);
            puc = json.GetValue<unsigned char*>("puc", tmp);
            ps = json.GetValue<short*>("ps", tmp);
            pus = json.GetValue<unsigned short*>("pus", tmp);
            pi = json.GetValue<int*>("pi", tmp);
            pui = json.GetValue<unsigned int*>("pui", tmp);
            pl = json.GetValue<long*>("pl", tmp);
            pul = json.GetValue<unsigned long*>("pul", tmp);
            pll = json.GetValue<long long*>("pll", tmp);
            pull = json.GetValue<unsigned long long*>("pull", tmp);
            pf = json.GetValue<float*>("pf", tmp);
            pd = json.GetValue<double*>("pd", tmp);
            pld = json.GetValue<long double*>("pld", tmp);

            pto = json.GetValue<TestArrObj*>("pto", tmp);
            spi = json.GetValue<shared_ptr<int>>("spi", tmp);
            spto = json.GetValue<shared_ptr<TestArrObj>>("spto", tmp);
        }